

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.hpp
# Opt level: O3

int __thiscall common_server_client_setup::init(common_server_client_setup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int iVar1;
  socklen_t in_ECX;
  SourceLineInfo *pSVar2;
  sockaddr *in_RDX;
  SourceLineInfo *optval_;
  sockaddr *__addr;
  StringRef macroName;
  StringRef capturedExpression;
  AssertionHandler catchAssertionHandler;
  size_t size;
  AssertionHandler local_78;
  SourceLineInfo local_30;
  
  zmq::detail::socket_base::bind(&(this->server).super_socket_base,0x1a3e44,in_RDX,in_ECX);
  pSVar2 = &local_78.m_assertionInfo.lineInfo;
  local_78.m_assertionInfo.macroName.m_start = (char *)pSVar2;
  std::__cxx11::string::_M_construct((ulong)&local_78,'d');
  optval_ = (SourceLineInfo *)local_78.m_assertionInfo.macroName.m_size;
  if ((SourceLineInfo *)local_78.m_assertionInfo.macroName.m_size != (SourceLineInfo *)0x0) {
    optval_ = (SourceLineInfo *)local_78.m_assertionInfo.macroName.m_start;
  }
  local_30.file = (char *)local_78.m_assertionInfo.macroName.m_size;
  zmq::detail::socket_base::get_option
            (&(this->server).super_socket_base,0x20,optval_,(size_t *)&local_30);
  std::__cxx11::string::resize((ulong)&local_78,(char)local_30.file);
  std::__cxx11::string::operator=((string *)&this->endpoint,(string *)&local_78);
  if ((SourceLineInfo *)local_78.m_assertionInfo.macroName.m_start != pSVar2) {
    operator_delete(local_78.m_assertionInfo.macroName.m_start,
                    (ulong)(local_78.m_assertionInfo.lineInfo.file + 1));
  }
  pSVar2 = &local_30;
  local_30.file =
       "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/testutil.hpp";
  local_30.line = 0x1b;
  macroName.m_size = 0xf;
  macroName.m_start = "REQUIRE_NOTHROW";
  capturedExpression.m_size = 0x18;
  capturedExpression.m_start = "client.connect(endpoint)";
  Catch::AssertionHandler::AssertionHandler(&local_78,macroName,pSVar2,capturedExpression,Normal);
  zmq::detail::socket_base::connect
            (&(this->client).super_socket_base,(int)(this->endpoint)._M_dataplus._M_p,__addr,
             (socklen_t)pSVar2);
  Catch::AssertionHandler::handleExceptionNotThrownAsExpected(&local_78);
  Catch::AssertionHandler::complete(&local_78);
  iVar1 = extraout_EAX;
  if (local_78.m_completed == false) {
    iVar1 = (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return iVar1;
}

Assistant:

void init()
    {
        endpoint = bind_ip4_loopback(server);
        REQUIRE_NOTHROW(client.connect(endpoint));
    }